

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

reference __thiscall
slang::SmallVectorBase<std::basic_string_view<char,std::char_traits<char>>>::
emplace_back<std::basic_string_view<char,std::char_traits<char>>const&>
          (SmallVectorBase<std::basic_string_view<char,std::char_traits<char>>> *this,
          basic_string_view<char,_std::char_traits<char>_> *args)

{
  ulong uVar1;
  char *pcVar2;
  size_t sVar3;
  size_t *psVar4;
  size_t *psVar5;
  size_t *psVar6;
  size_t *psVar7;
  EVP_PKEY_CTX *pEVar8;
  size_t *psVar9;
  EVP_PKEY_CTX *ctx;
  long lVar10;
  
  psVar9 = (size_t *)(*(long *)(this + 8) * 0x10 + *(long *)this);
  if (*(long *)(this + 8) != *(long *)(this + 0x10)) {
    pcVar2 = args->_M_str;
    *psVar9 = args->_M_len;
    psVar9[1] = (size_t)pcVar2;
    lVar10 = *(long *)(this + 8);
    *(long *)(this + 8) = lVar10 + 1;
    return (reference)(*(long *)this + (lVar10 + 1) * 0x10 + -0x10);
  }
  if (*(long *)(this + 8) == 0x7ffffffffffffff) {
    detail::throwLengthError();
  }
  pEVar8 = (EVP_PKEY_CTX *)(*(long *)(this + 8) + 1);
  uVar1 = *(ulong *)(this + 0x10);
  ctx = (EVP_PKEY_CTX *)(uVar1 * 2);
  if (pEVar8 < ctx) {
    pEVar8 = ctx;
  }
  if (0x7ffffffffffffff - uVar1 < uVar1) {
    pEVar8 = (EVP_PKEY_CTX *)0x7ffffffffffffff;
  }
  lVar10 = (long)psVar9 - *(long *)this;
  psVar4 = (size_t *)operator_new((long)pEVar8 << 4);
  pcVar2 = args->_M_str;
  *(size_t *)((long)psVar4 + lVar10) = args->_M_len;
  ((size_t *)((long)psVar4 + lVar10))[1] = (size_t)pcVar2;
  psVar7 = *(size_t **)this;
  psVar5 = psVar7 + *(long *)(this + 8) * 2;
  psVar6 = psVar4;
  if (psVar5 == psVar9) {
    for (; psVar7 != psVar9; psVar7 = psVar7 + 2) {
      sVar3 = psVar7[1];
      *psVar6 = *psVar7;
      psVar6[1] = sVar3;
      psVar6 = psVar6 + 2;
    }
  }
  else {
    for (; psVar7 != psVar9; psVar7 = psVar7 + 2) {
      sVar3 = psVar7[1];
      *psVar6 = *psVar7;
      psVar6[1] = sVar3;
      psVar6 = psVar6 + 2;
    }
    psVar7 = (size_t *)(lVar10 + (long)psVar4);
    for (; psVar9 != psVar5; psVar9 = psVar9 + 2) {
      sVar3 = psVar9[1];
      psVar7[2] = *psVar9;
      psVar7[3] = sVar3;
      psVar7 = psVar7 + 2;
    }
  }
  SmallVectorBase<std::basic_string_view<char,_std::char_traits<char>_>_>::cleanup
            ((SmallVectorBase<std::basic_string_view<char,_std::char_traits<char>_>_> *)this,ctx);
  *(long *)(this + 8) = *(long *)(this + 8) + 1;
  *(EVP_PKEY_CTX **)(this + 0x10) = pEVar8;
  *(size_t **)this = psVar4;
  return (reference)((long)psVar4 + lVar10);
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }